

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemZeroTerminateIfAble(Mem *pMem)

{
  sqlite3_uint64 sVar1;
  long in_RDI;
  
  if ((((*(ushort *)(in_RDI + 0x14) & 0x6202) == 2) && (*(char *)(in_RDI + 0x16) == '\x01')) &&
     (*(long *)(in_RDI + 8) != 0)) {
    if ((*(ushort *)(in_RDI + 0x14) & 0x1000) == 0) {
      if (*(int *)(in_RDI + 0x10) + 1 <= *(int *)(in_RDI + 0x20)) {
        *(undefined1 *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x10)) = 0;
        *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) | 0x200;
      }
    }
    else if ((*(code **)(in_RDI + 0x30) == sqlite3_free) &&
            (sVar1 = sqlite3_msize(pMem), (ulong)(long)(*(int *)(in_RDI + 0x10) + 1) <= sVar1)) {
      *(undefined1 *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x10)) = 0;
      *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) | 0x200;
    }
    else if (*(code **)(in_RDI + 0x30) == sqlite3RCStrUnref) {
      *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) | 0x200;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemZeroTerminateIfAble(Mem *pMem){
  if( (pMem->flags & (MEM_Str|MEM_Term|MEM_Ephem|MEM_Static))!=MEM_Str ){
    /* pMem must be a string, and it cannot be an ephemeral or static string */
    return;
  }
  if( pMem->enc!=SQLITE_UTF8 ) return;
  if( NEVER(pMem->z==0) ) return;
  if( pMem->flags & MEM_Dyn ){
    if( pMem->xDel==sqlite3_free
     && sqlite3_msize(pMem->z) >= (u64)(pMem->n+1)
    ){
      pMem->z[pMem->n] = 0;
      pMem->flags |= MEM_Term;
      return;
    }
    if( pMem->xDel==sqlite3RCStrUnref ){
      /* Blindly assume that all RCStr objects are zero-terminated */
      pMem->flags |= MEM_Term;
      return;
    }
  }else if( pMem->szMalloc >= pMem->n+1 ){
    pMem->z[pMem->n] = 0;
    pMem->flags |= MEM_Term;
    return;
  }
}